

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::ShaderAtomicAndCase::verify
          (ShaderAtomicAndCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *poVar1;
  uint uVar2;
  Precision PVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 extraout_RDX;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  int in_stack_00000008;
  long in_stack_00000010;
  Hex<8UL> local_1c0;
  ulong local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  lVar8 = 0;
  uVar14 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0];
  do {
    uVar13 = uVar14;
    uVar2 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[lVar8 + 1];
    uVar14 = uVar2 * uVar13;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 2);
  local_1b8 = (long)((ulong)(uint)((int)ctx >> 0x1f) << 0x20 | (ulong)ctx & 0xffffffff) /
              (long)(int)uVar14;
  PVar3 = (this->super_ShaderAtomicOpCase).m_precision;
  uVar11 = 0xff;
  if (PVar3 == PRECISION_MEDIUMP) {
    uVar11 = 0xffff;
  }
  if ((this->super_ShaderAtomicOpCase).m_type == TYPE_UINT) {
    uVar11 = 0xffffffff;
  }
  if (PVar3 == PRECISION_HIGHP) {
    uVar11 = 0xffffffff;
  }
  iVar15 = (int)local_1b8;
  uVar16 = CONCAT31((int3)(PVar3 >> 8),iVar15 < 1);
  uVar9 = (ulong)uVar16;
  if (0 < iVar15) {
    uVar4 = (this->super_ShaderAtomicOpCase).m_initialValue;
    local_1b8 = local_1b8 & 0xffffffff;
    uVar6 = 0;
    iVar15 = 0;
    uVar18 = 0;
    do {
      uVar10 = (ulong)uVar14;
      uVar16 = uVar4;
      iVar12 = iVar15;
      if (0 < (int)uVar14) {
        do {
          uVar16 = uVar16 & *(uint *)(siglen + (long)iVar12);
          iVar12 = iVar12 + (int)sig;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
      iVar12 = (int)uVar18;
      uVar5 = *(uint *)(in_stack_00000010 + iVar12 * in_stack_00000008);
      uVar7 = uVar5 ^ uVar16;
      uVar10 = (ulong)uVar7;
      if ((uVar11 & uVar7) != 0) {
        local_1b0._0_8_ =
             ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"ERROR: at group ",0x10);
        std::ostream::operator<<(poVar1,iVar12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,": expected ",0xb);
        local_1c0.value = (deUint64)uVar16;
        tcu::Format::Hex<8UL>::toStream(&local_1c0,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", got ",6);
        local_1c0.value = (ulong)uVar5;
        tcu::Format::Hex<8UL>::toStream(&local_1c0,(ostream *)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0149a5dd:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
        return (int)CONCAT71((int7)((ulong)extraout_RDX >> 8),(char)uVar9);
      }
      if (0 < (int)uVar14) {
        uVar10 = (ulong)uVar6;
        uVar17 = 0;
        do {
          uVar16 = *(uint *)(tbslen + (long)(int)uVar10);
          if ((~uVar4 & uVar11 & uVar16) != 0) {
            local_1b0._0_8_ =
                 ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx)->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"ERROR: at group ",0x10);
            std::ostream::operator<<(poVar1,iVar12);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,", invocation ",0xd);
            std::ostream::operator<<(poVar1,(int)uVar17);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,": found unexpected value ",0x19);
            local_1c0.value = (ulong)uVar16;
            tcu::Format::Hex<8UL>::toStream(&local_1c0,(ostream *)poVar1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_0149a5dd;
          }
          uVar17 = uVar17 + 1;
          uVar10 = (ulong)(uint)((int)uVar10 + (int)tbs);
        } while (uVar14 != uVar17);
      }
      uVar18 = uVar18 + 1;
      uVar9 = CONCAT71((int7)(uVar10 >> 8),local_1b8 <= uVar18);
      uVar16 = (uint)uVar9;
      iVar15 = iVar15 + (int)sig * uVar13 * uVar2;
      uVar6 = uVar6 + uVar13 * (int)tbs * uVar2;
    } while (uVar18 != local_1b8);
  }
  return uVar16;
}

Assistant:

bool verify (int numValues, int inputStride, const void* inputs, int outputStride, const void* outputs, int groupStride, const void* groupOutputs) const
	{
		const int		workGroupSize	= (int)product(m_workGroupSize);
		const int		numWorkGroups	= numValues/workGroupSize;
		const int		numBits			= m_precision == PRECISION_HIGHP ? 32 :
										  m_precision == PRECISION_MEDIUMP ? 16 : 8;
		const deUint32	compareMask		= (m_type == TYPE_UINT || numBits == 32) ? ~0u : (1u<<numBits)-1u;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int		groupOffset		= groupNdx*workGroupSize;
			const deUint32	groupOutput		= *(const deUint32*)((const deUint8*)groupOutputs + groupNdx*groupStride);
			deUint32		expectedValue	= m_initialValue;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 inputValue = *(const deUint32*)((const deUint8*)inputs + inputStride*(groupOffset+localNdx));
				expectedValue &= inputValue;
			}

			if ((groupOutput & compareMask) != (expectedValue & compareMask))
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ": expected " << tcu::toHex(expectedValue) << ", got " << tcu::toHex(groupOutput) << TestLog::EndMessage;
				return false;
			}

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 outputValue = *(const deUint32*)((const deUint8*)outputs + outputStride*(groupOffset+localNdx));

				if ((compareMask & (outputValue & ~m_initialValue)) != 0)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": found unexpected value " << tcu::toHex(outputValue)
									   << TestLog::EndMessage;
					return false;
				}
			}
		}

		return true;
	}